

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  string linkProp;
  size_type __dnew;
  size_type __dnew_2;
  string suffix;
  char *imp;
  char *loc;
  string local_a8;
  string local_88;
  size_type local_68;
  string local_60;
  char *local_40;
  char *local_38;
  
  info->NoSOName = false;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  bVar3 = cmTarget::GetMappedConfig(this->Target,desired_config,&local_38,&local_40,&local_60);
  if (!bVar3) goto LAB_00336588;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88._M_dataplus._M_p = (pointer)0x18;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
  local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_a8._M_dataplus._M_p = 0x4341465245544e49;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 8) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 9) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 10) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xb) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xc) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xd) = 'K';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xe) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xf) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x10) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x11) = 'B';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x12) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x13) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x14) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x15) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x16) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x17) = 'S';
  local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
  pcVar4 = GetProperty(this,&local_a8);
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
LAB_00335a79:
    if (pcVar4 != (char *)0x0) goto LAB_00335acc;
  }
  else {
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a8,0,(char *)local_a8._M_string_length,0x4e0b40);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
      pcVar4 = GetProperty(this,&local_a8);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_a8,0,(char *)local_a8._M_string_length,0x4e0b40);
        pcVar4 = GetProperty(this,&local_a8);
        goto LAB_00335a79;
      }
    }
LAB_00335acc:
    std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
    pcVar2 = (char *)(info->Libraries)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&info->Libraries,0,pcVar2,(ulong)pcVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  pcVar4 = local_38;
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    if (local_38 != (char *)0x0) {
      pcVar2 = (char *)(info->LibName)._M_string_length;
      strlen(local_38);
      std::__cxx11::string::_M_replace((ulong)&info->LibName,0,pcVar2,(ulong)pcVar4);
    }
    goto LAB_00336588;
  }
  if (local_38 == (char *)0x0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_88._M_dataplus._M_p = (pointer)0x11;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
    local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 8) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 9) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 10) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xb) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xc) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xd) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xe) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xf) = 'O';
    local_a8._M_dataplus._M_p[0x10] = 'N';
    local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
    local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
    pcVar4 = GetProperty(this,&local_a8);
    if (pcVar4 == (char *)0x0) {
      local_68 = 0x11;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
      local_88.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
      local_88.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
      *(undefined8 *)local_88._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 9) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 0xc) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 0xd) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p + 0xf) = 'O';
      local_88._M_dataplus._M_p[0x10] = 'N';
      local_88._M_string_length = local_68;
      local_88._M_dataplus._M_p[local_68] = '\0';
      pcVar4 = GetProperty(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT17(local_88.field_2._M_local_buf[7],
                                 local_88.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar4 != (char *)0x0) {
        pcVar2 = (char *)(info->Location)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar2,(ulong)pcVar4);
      }
    }
    else {
      pcVar2 = (char *)(info->Location)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar2,(ulong)pcVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               local_a8.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  else {
    pcVar2 = (char *)(info->Location)._M_string_length;
    strlen(local_38);
    std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar2,(ulong)pcVar4);
  }
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
    local_a8.field_2._M_local_buf[7] = 'D';
    local_a8.field_2._8_7_ = 0x454d414e4f535f;
    local_a8._M_string_length = 0xf;
    local_a8.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
    pcVar4 = GetProperty(this,&local_a8);
    if (pcVar4 == (char *)0x0) {
      local_88.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
      local_88.field_2._M_local_buf[7] = 'D';
      local_88.field_2._8_7_ = 0x454d414e4f535f;
      local_88._M_string_length = 0xf;
      local_88.field_2._M_local_buf[0xf] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar4 = GetProperty(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT17(local_88.field_2._M_local_buf[7],
                                 local_88.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar4 != (char *)0x0) {
        pcVar2 = (char *)(info->SOName)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&info->SOName,0,pcVar2,(ulong)pcVar4);
      }
    }
    else {
      pcVar2 = (char *)(info->SOName)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&info->SOName,0,pcVar2,(ulong)pcVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               local_a8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_88._M_dataplus._M_p = (pointer)0x12;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
      local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
      local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 9) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xb) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x10) = 'M';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x11) = 'E';
      local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
      local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
      pcVar4 = GetProperty(this,&local_a8);
      if (pcVar4 == (char *)0x0) {
        local_68 = 0x12;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
        local_88.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
        local_88.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
        *(undefined8 *)local_88._M_dataplus._M_p = 0x444554524f504d49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 8) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 9) = 'N';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 10) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0xb) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0xc) = 'S';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0xd) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0xe) = 'N';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0xf) = 'A';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0x10) = 'M';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p + 0x11) = 'E';
        local_88._M_string_length = local_68;
        local_88._M_dataplus._M_p[local_68] = '\0';
        pcVar4 = GetProperty(this,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT17(local_88.field_2._M_local_buf[7],
                                   local_88.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (pcVar4 != (char *)0x0) {
          bVar3 = cmSystemTools::IsOn(pcVar4);
          goto LAB_00335f11;
        }
      }
      else {
        bVar3 = cmSystemTools::IsOn(pcVar4);
LAB_00335f11:
        info->NoSOName = bVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
    }
  }
  pcVar4 = local_40;
  if (local_40 == (char *)0x0) {
    if ((this->Target->TargetTypeValue == SHARED_LIBRARY) ||
       (bVar3 = IsExecutableWithExports(this), bVar3)) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
      local_a8.field_2._M_local_buf[7] = 'D';
      local_a8.field_2._8_7_ = 0x42494c504d495f;
      local_a8._M_string_length = 0xf;
      local_a8.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
      pcVar4 = GetProperty(this,&local_a8);
      if (pcVar4 == (char *)0x0) {
        local_88.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
        local_88.field_2._M_local_buf[7] = 'D';
        local_88.field_2._8_7_ = 0x42494c504d495f;
        local_88._M_string_length = 0xf;
        local_88.field_2._M_local_buf[0xf] = '\0';
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar4 = GetProperty(this,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT17(local_88.field_2._M_local_buf[7],
                                   local_88.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)&info->ImportLibrary,pcVar4);
        }
      }
      else {
        pcVar2 = (char *)(info->ImportLibrary)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&info->ImportLibrary,0,pcVar2,(ulong)pcVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
    }
  }
  else {
    pcVar2 = (char *)(info->ImportLibrary)._M_string_length;
    strlen(local_40);
    std::__cxx11::string::_M_replace((ulong)&info->ImportLibrary,0,pcVar2,(ulong)pcVar4);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88._M_dataplus._M_p = (char *)0x21;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
  local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_a8._M_dataplus._M_p,"IMPORTED_LINK_DEPENDENT_LIBRARIES",0x21);
  local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
  pcVar4 = GetProperty(this,&local_a8);
  if (pcVar4 == (char *)0x0) {
    local_68 = 0x21;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
    local_88.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
    builtin_strncpy(local_88._M_dataplus._M_p,"IMPORTED_LINK_DEPENDENT_LIBRARIES",0x21);
    local_88._M_string_length = local_68;
    local_88._M_dataplus._M_p[local_68] = '\0';
    pcVar4 = GetProperty(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT17(local_88.field_2._M_local_buf[7],
                               local_88.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (pcVar4 != (char *)0x0) {
      pcVar2 = (char *)(info->SharedDeps)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&info->SharedDeps,0,pcVar2,(ulong)pcVar4);
    }
  }
  else {
    pcVar2 = (char *)(info->SharedDeps)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&info->SharedDeps,0,pcVar2,(ulong)pcVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (this->Target->TargetTypeValue == STATIC_LIBRARY) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_88._M_dataplus._M_p = (char *)0x21;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
    local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_a8._M_dataplus._M_p,"IMPORTED_LINK_INTERFACE_LANGUAGES",0x21);
    local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
    local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
    pcVar4 = GetProperty(this,&local_a8);
    if (pcVar4 == (char *)0x0) {
      local_68 = 0x21;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
      local_88.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
      local_88.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
      builtin_strncpy(local_88._M_dataplus._M_p,"IMPORTED_LINK_INTERFACE_LANGUAGES",0x21);
      local_88._M_string_length = local_68;
      local_88._M_dataplus._M_p[local_68] = '\0';
      pcVar4 = GetProperty(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT17(local_88.field_2._M_local_buf[7],
                                 local_88.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar4 != (char *)0x0) {
        pcVar2 = (char *)(info->Languages)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&info->Languages,0,pcVar2,(ulong)pcVar4);
      }
    }
    else {
      pcVar2 = (char *)(info->Languages)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&info->Languages,0,pcVar2,(ulong)pcVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               local_a8.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88._M_dataplus._M_p = (pointer)0x20;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
  local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x10) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x11) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x12) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x13) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x14) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x15) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x16) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x17) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x18) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x19) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1a) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1b) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1c) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1d) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1e) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1f) = 'E';
  *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 8) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 9) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 10) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xb) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xc) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xd) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xe) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xf) = '_';
  local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
  std::operator+(&local_88,&local_a8,&local_60);
  pcVar4 = GetProperty(this,&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT17(local_88.field_2._M_local_buf[7],
                             local_88.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (pcVar4 == (char *)0x0) {
    pcVar4 = GetProperty(this,&local_a8);
    if (pcVar4 != (char *)0x0) {
      local_88._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar4,pcVar4 + sVar5);
      goto LAB_00336418;
    }
  }
  else {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar4,pcVar4 + sVar5);
LAB_00336418:
    info->Managed = Managed - (local_88._M_string_length == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT17(local_88.field_2._M_local_buf[7],
                               local_88.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) goto LAB_00336588;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_88._M_dataplus._M_p = (pointer)0x24;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
  local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x10) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x11) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x12) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x13) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x14) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x15) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x16) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x17) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x18) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x19) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1a) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1b) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1c) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1d) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1e) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1f) = 'I';
  *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 8) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 9) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 10) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xb) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xc) = 'K';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xd) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xe) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xf) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x20) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x21) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x22) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x23) = 'Y';
  local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
  pcVar4 = GetProperty(this,&local_a8);
  if (pcVar4 == (char *)0x0) {
    local_68 = 0x24;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity._0_7_ = (undefined7)local_68;
    local_88.field_2._M_local_buf[7] = (char)(local_68 >> 0x38);
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x10) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x11) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x12) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x13) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x14) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x15) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x16) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x17) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x18) = 'M';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x19) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1a) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1b) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1c) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1d) = 'P';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1e) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x1f) = 'I';
    *(undefined8 *)local_88._M_dataplus._M_p = 0x444554524f504d49;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 8) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 9) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 10) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xb) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xc) = 'K';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xd) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xe) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0xf) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x20) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x21) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x22) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p + 0x23) = 'Y';
    local_88._M_string_length = local_68;
    local_88._M_dataplus._M_p[local_68] = '\0';
    pcVar4 = GetProperty(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT17(local_88.field_2._M_local_buf[7],
                               local_88.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (pcVar4 != (char *)0x0) goto LAB_00336555;
  }
  else {
LAB_00336555:
    __isoc99_sscanf(pcVar4,"%u",&info->Multiplicity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
LAB_00336588:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                          ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  const char* loc = nullptr;
  const char* imp = nullptr;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, &loc, &imp, suffix)) {
    return;
  }

  // Get the link interface.
  {
    std::string linkProp = "INTERFACE_LINK_LIBRARIES";
    const char* propertyLibs = this->GetProperty(linkProp);

    if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        linkProp += suffix;
        propertyLibs = this->GetProperty(linkProp);
      }

      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        propertyLibs = this->GetProperty(linkProp);
      }
    }
    if (propertyLibs) {
      info.LibrariesProp = linkProp;
      info.Libraries = propertyLibs;
    }
  }
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    if (loc) {
      info.LibName = loc;
    }
    return;
  }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if (loc) {
    info.Location = loc;
  } else {
    std::string impProp = "IMPORTED_LOCATION";
    impProp += suffix;
    if (const char* config_location = this->GetProperty(impProp)) {
      info.Location = config_location;
    } else if (const char* location = this->GetProperty("IMPORTED_LOCATION")) {
      info.Location = location;
    }
  }

  // Get the soname.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = "IMPORTED_SONAME";
    soProp += suffix;
    if (const char* config_soname = this->GetProperty(soProp)) {
      info.SOName = config_soname;
    } else if (const char* soname = this->GetProperty("IMPORTED_SONAME")) {
      info.SOName = soname;
    }
  }

  // Get the "no-soname" mark.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = "IMPORTED_NO_SONAME";
    soProp += suffix;
    if (const char* config_no_soname = this->GetProperty(soProp)) {
      info.NoSOName = cmSystemTools::IsOn(config_no_soname);
    } else if (const char* no_soname =
                 this->GetProperty("IMPORTED_NO_SONAME")) {
      info.NoSOName = cmSystemTools::IsOn(no_soname);
    }
  }

  // Get the import library.
  if (imp) {
    info.ImportLibrary = imp;
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    std::string impProp = "IMPORTED_IMPLIB";
    impProp += suffix;
    if (const char* config_implib = this->GetProperty(impProp)) {
      info.ImportLibrary = config_implib;
    } else if (const char* implib = this->GetProperty("IMPORTED_IMPLIB")) {
      info.ImportLibrary = implib;
    }
  }

  // Get the link dependencies.
  {
    std::string linkProp = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
    linkProp += suffix;
    if (const char* config_libs = this->GetProperty(linkProp)) {
      info.SharedDeps = config_libs;
    } else if (const char* libs =
                 this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES")) {
      info.SharedDeps = libs;
    }
  }

  // Get the link languages.
  if (this->LinkLanguagePropagatesToDependents()) {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    linkProp += suffix;
    if (const char* config_libs = this->GetProperty(linkProp)) {
      info.Languages = config_libs;
    } else if (const char* libs =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES")) {
      info.Languages = libs;
    }
  }

  // Get information if target is managed assembly.
  {
    std::string linkProp = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    if (auto pc = this->GetProperty(linkProp + suffix)) {
      info.Managed = this->CheckManagedType(pc);
    } else if (auto p = this->GetProperty(linkProp)) {
      info.Managed = this->CheckManagedType(p);
    }
  }

  // Get the cyclic repetition count.
  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
    linkProp += suffix;
    if (const char* config_reps = this->GetProperty(linkProp)) {
      sscanf(config_reps, "%u", &info.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &info.Multiplicity);
    }
  }
}